

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall maths::operator-(maths *this,Matrix *m1,Matrix *m2)

{
  double **extraout_RDX;
  Matrix MVar1;
  Matrix temp;
  Matrix MStack_28;
  
  Matrix::Matrix(&MStack_28,m1);
  Matrix::operator-=(&MStack_28,m2);
  Matrix::Matrix((Matrix *)this,&MStack_28);
  Matrix::~Matrix(&MStack_28);
  MVar1.p = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

Matrix operator-(const Matrix& m1, const Matrix& m2)
{
    Matrix temp(m1);
    return (temp -= m2);
}